

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

void __thiscall
irr::io::CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase>::parseComment
          (CXMLReaderImpl<unsigned_long,_irr::io::IXMLBase> *this)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  int iVar4;
  ulong uVar5;
  string<unsigned_long> local_20;
  
  this->CurrentNodeType = EXN_COMMENT;
  puVar1 = this->P;
  this->P = puVar1 + 1;
  iVar4 = 1;
  uVar5 = 0xffffffffffffffe8;
  puVar2 = puVar1 + 2;
  do {
    puVar3 = puVar2;
    if (puVar3[-1] == 0x3c) {
      iVar4 = iVar4 + 1;
    }
    else if (puVar3[-1] == 0x3e) {
      iVar4 = iVar4 + -1;
    }
    this->P = puVar3;
    uVar5 = uVar5 + 8;
    puVar2 = puVar3 + 1;
  } while (iVar4 != 0);
  this->P = puVar3 + -3;
  core::string<unsigned_long>::string<unsigned_long>(&local_20,puVar1 + 3,(int)(uVar5 >> 3) + -2);
  core::string<unsigned_long>::operator=(&this->NodeName,&local_20);
  if (local_20.array != (unsigned_long *)0x0) {
    operator_delete__(local_20.array);
  }
  this->P = this->P + 3;
  return;
}

Assistant:

void parseComment()
	{
		CurrentNodeType = EXN_COMMENT;
		P += 1;

		char_type *pCommentBegin = P;

		int count = 1;

		// move until end of comment reached
		while(count)
		{
			if (*P == L'>')
				--count;
			else
			if (*P == L'<')
				++count;

			++P;
		}

		P -= 3;
		NodeName = core::string<char_type>(pCommentBegin+2, (int)(P - pCommentBegin-2));
		P += 3;
	}